

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-chunk.c
# Opt level: O0

void symmetry_transform(loc *grid,wchar_t y0,wchar_t x0,wchar_t height,wchar_t width,wchar_t rotate,
                       _Bool reflect)

{
  int iVar1;
  wchar_t wVar2;
  int local_34;
  wchar_t temp;
  wchar_t i;
  wchar_t rwidth;
  wchar_t rheight;
  _Bool reflect_local;
  wchar_t rotate_local;
  wchar_t width_local;
  wchar_t height_local;
  wchar_t x0_local;
  wchar_t y0_local;
  loc *grid_local;
  
  temp = width;
  i = height;
  for (local_34 = 0; wVar2 = temp, local_34 < rotate % 4; local_34 = local_34 + 1) {
    iVar1 = grid->x;
    grid->x = (i + L'\xffffffff') - grid->y;
    grid->y = iVar1;
    temp = i;
    i = wVar2;
  }
  if (reflect) {
    grid->x = (temp + L'\xffffffff') - grid->x;
  }
  grid->y = y0 + grid->y;
  grid->x = x0 + grid->x;
  return;
}

Assistant:

void symmetry_transform(struct loc *grid, int y0, int x0, int height, int width,
						int rotate, bool reflect)
{
	/* Track what the dimensions are after rotations. */
	int rheight = height, rwidth = width;
	int i;

	/* Rotate (in multiples of 90 degrees clockwise) */
	for (i = 0; i < rotate % 4; i++) {
		int temp = grid->x;
		grid->x = rheight - 1 - (grid->y);
		grid->y = temp;
		temp = rwidth;
		rwidth = rheight;
		rheight = temp;
	}

	/* Reflect (horizontally in the rotated system) */
	if (reflect)
		grid->x = rwidth - 1 - grid->x;

	/* Translate */
	grid->y += y0;
	grid->x += x0;
}